

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmcreg.cpp
# Opt level: O2

void vm_register_metaclasses(void)

{
  vm_meta_reg_t *entry;
  uint i;
  uint uVar1;
  
  uVar1 = 0;
  for (entry = G_meta_reg_table; entry->meta != (CVmMetaclass **)0x0; entry = entry + 1) {
    (*entry->meta)->meta_reg_idx_ = uVar1;
    uVar1 = uVar1 + 1;
  }
  return;
}

Assistant:

void vm_register_metaclasses()
{
    uint i;
    vm_meta_reg_t *entry;
    
    /* 
     *   run through the metaclass table and tell each metaclass its
     *   registration table index 
     */
    for (i = 0, entry = G_meta_reg_table ; entry->meta != 0 ;
         ++i, ++entry)
    {
        /* 
         *   Call this entry's class method to set its registration index.
         *   This is static information that never changes throughout the
         *   program's execution - we simply establish the registration
         *   table index for each metaclass once upon initialization.  
         */
        (*entry->meta)->set_metaclass_reg_index(i);
    }
}